

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int serial_initialize(void)

{
  int iVar1;
  void *in_stack_00001020;
  plugin_manager_interface in_stack_00001028;
  char *in_stack_00001030;
  char *in_stack_00001038;
  char *in_stack_00001040;
  plugin_manager in_stack_00001048;
  
  iVar1 = plugin_manager_initialize
                    (in_stack_00001048,in_stack_00001040,in_stack_00001038,in_stack_00001030,
                     in_stack_00001028,in_stack_00001020);
  return iVar1;
}

Assistant:

int serial_initialize(void)
{
	return plugin_manager_initialize(
		&serial_manager,
		SERIAL_MANAGER_NAME,
		SERIAL_LIBRARY_PATH,
#if defined(SERIAL_LIBRARY_INSTALL_PATH)
		SERIAL_LIBRARY_INSTALL_PATH,
#else
		SERIAL_LIBRARY_DEFAULT_PATH,
#endif /* SERIAL_LIBRARY_INSTALL_PATH */
		NULL,
		NULL);
}